

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O0

void __thiscall
copy_on_write<BaseType>::copy_on_write<DerivedType,void>
          (copy_on_write<BaseType> *this,copy_on_write<DerivedType> *c)

{
  shared_ptr<delegating_shared_control_block<BaseType,_DerivedType>_> local_38;
  shared_ptr<delegating_shared_control_block<BaseType,_DerivedType>_> local_28;
  copy_on_write<DerivedType> *local_18;
  copy_on_write<DerivedType> *c_local;
  copy_on_write<BaseType> *this_local;
  
  this->ptr_ = (BaseType *)0x0;
  local_18 = c;
  c_local = (copy_on_write<DerivedType> *)this;
  std::shared_ptr<shared_control_block<BaseType>_>::shared_ptr(&this->cb_);
  this->ptr_ = &local_18->ptr_->super_BaseType;
  std::
  make_shared<delegating_shared_control_block<BaseType,DerivedType>,std::shared_ptr<shared_control_block<DerivedType>>>
            ((shared_ptr<shared_control_block<DerivedType>_> *)&local_38);
  std::
  static_pointer_cast<shared_control_block<BaseType>,delegating_shared_control_block<BaseType,DerivedType>>
            (&local_28);
  std::shared_ptr<shared_control_block<BaseType>_>::operator=
            (&this->cb_,(shared_ptr<shared_control_block<BaseType>_> *)&local_28);
  std::shared_ptr<shared_control_block<BaseType>_>::~shared_ptr
            ((shared_ptr<shared_control_block<BaseType>_> *)&local_28);
  std::shared_ptr<delegating_shared_control_block<BaseType,_DerivedType>_>::~shared_ptr(&local_38);
  local_18->ptr_ = (DerivedType *)0x0;
  return;
}

Assistant:

copy_on_write(copy_on_write<U>&& c)
  {
    ptr_ = c.ptr_;
    cb_ = std::static_pointer_cast<shared_control_block<T>>(
        std::make_shared<delegating_shared_control_block<T, U>>(
            std::move(c.cb_)));
    c.ptr_ = nullptr;
  }